

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_catalog_entry.cpp
# Opt level: O1

void __thiscall
duckdb::TableCatalogEntry::BindUpdateConstraints
          (TableCatalogEntry *this,Binder *binder,LogicalGet *get,LogicalProjection *proj,
          LogicalUpdate *update,ClientContext *context)

{
  ulong uVar1;
  long *plVar2;
  pointer pPVar3;
  undefined2 *puVar4;
  undefined8 this_00;
  undefined8 get_00;
  undefined8 proj_00;
  bool bVar5;
  pointer pBVar6;
  BoundCheckConstraint *pBVar7;
  ColumnList *pCVar8;
  ColumnDefinition *pCVar9;
  long *plVar10;
  LogicalType *this_01;
  ColumnList *pCVar11;
  pointer pPVar12;
  unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
  *constraint;
  pointer this_02;
  long lVar13;
  long *plVar14;
  idx_t iVar15;
  undefined2 *puVar16;
  idx_t iVar17;
  ColumnListIterator CVar18;
  TableStorageInfo table_storage_info;
  ColumnLogicalIteratorInternal __begin2_1;
  physical_index_set_t all_columns;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
  bound_constraints;
  undefined1 local_f8 [16];
  undefined2 *local_e8;
  idx_t local_e0;
  ColumnLogicalIteratorInternal local_d8;
  undefined1 local_b8 [16];
  __node_base local_a8;
  __buckets_ptr pp_Stack_a0;
  size_type local_98;
  __node_base local_90;
  undefined1 auStack_88 [40];
  ClientContext *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  idx_t local_50;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  local_48;
  
  pCVar11 = &this->columns;
  local_60 = context;
  Binder::BindConstraints
            ((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
              *)&local_48,binder,&this->constraints,
             &(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name,pCVar11);
  for (this_02 = local_48.
                 super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_02 !=
      local_48.
      super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; this_02 = this_02 + 1) {
    pBVar6 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
             ::operator->(this_02);
    if (pBVar6->type == CHECK) {
      pBVar6 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
               ::operator->(this_02);
      pBVar7 = BoundConstraint::Cast<duckdb::BoundCheckConstraint>(pBVar6);
      LogicalUpdate::BindExtraColumns(this,get,proj,update,&pBVar7->bound_columns);
    }
  }
  if (update->return_chunk != false) {
    local_b8._0_8_ = auStack_88;
    local_b8._8_8_ = &DAT_00000001;
    local_a8._M_nxt = (_Hash_node_base *)0x0;
    pp_Stack_a0 = (__buckets_ptr)0x0;
    local_98 = CONCAT44(local_98._4_4_,0x3f800000);
    local_90._M_nxt = (_Hash_node_base *)0x0;
    auStack_88._0_8_ = (__node_base_ptr)0x0;
    CVar18 = ColumnList::Physical(pCVar11);
    pCVar8 = CVar18.list;
    local_f8[8] = CVar18.physical;
    if (((undefined1  [16])CVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_e0 = ((long)(pCVar8->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pCVar8->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    }
    else {
      local_e0 = (long)(pCVar8->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pCVar8->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
    }
    local_e8 = (undefined2 *)0x0;
    if (((undefined1  [16])CVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      lVar13 = ((long)(pCVar8->columns).
                      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      .
                      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pCVar8->columns).
                      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      .
                      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    }
    else {
      lVar13 = (long)(pCVar8->physical_columns).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pCVar8->physical_columns).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
    }
    if (((undefined1  [16])CVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      iVar15 = ((long)(pCVar8->columns).
                      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      .
                      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pCVar8->columns).
                      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      .
                      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    }
    else {
      iVar15 = (long)(pCVar8->physical_columns).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pCVar8->physical_columns).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
    }
    local_f8._0_8_ = pCVar8;
    if ((lVar13 != 0) || (local_e0 != iVar15)) {
      do {
        do {
          pCVar9 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                             ((ColumnLogicalIteratorInternal *)local_f8);
          local_58._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ColumnDefinition::Physical(pCVar9);
          local_d8.list = (ColumnList *)local_b8;
          ::std::
          _Hashtable<duckdb::PhysicalIndex,duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::PhysicalIndex>,duckdb::PhysicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<duckdb::PhysicalIndex,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::PhysicalIndex,true>>>>
                    ();
          local_e8 = (undefined2 *)((long)local_e8 + 1);
        } while (local_e8 != (undefined2 *)lVar13);
      } while ((local_e0 != iVar15) || ((ColumnList *)local_f8._0_8_ != pCVar8));
    }
    LogicalUpdate::BindExtraColumns(this,get,proj,update,(physical_index_set_t *)local_b8);
    ::std::
    _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_b8);
  }
  update->update_is_del_and_insert = false;
  auStack_88._16_8_ = pCVar11;
  auStack_88._24_8_ = get;
  auStack_88._32_8_ = proj;
  (*(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry[0x17])
            (local_f8,this,local_60);
  puVar4 = local_e8;
  puVar16 = (undefined2 *)CONCAT71(local_f8._9_7_,local_f8[8]);
  if (puVar16 != local_e8) {
    pCVar11 = (ColumnList *)(local_b8 + 8);
    do {
      local_b8[2] = *(undefined1 *)(puVar16 + 1);
      local_b8._0_2_ = *puVar16;
      local_b8._8_8_ = (pointer)0x0;
      local_a8._M_nxt = *(_Hash_node_base **)(puVar16 + 8);
      pp_Stack_a0 = (__buckets_ptr)0x0;
      local_98 = *(size_type *)(puVar16 + 0x10);
      local_90._M_nxt = *(_Hash_node_base **)(puVar16 + 0x14);
      auStack_88._0_8_ = *(undefined8 *)(puVar16 + 0x18);
      auStack_88._8_8_ = 0;
      local_d8.list = pCVar11;
      ::std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)pCVar11,
                 (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)(puVar16 + 4),
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> *)
                 &local_d8);
      for (pPVar12 = (update->columns).
                     super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                     super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pPVar12 !=
          (update->columns).
          super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
          super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
          super__Vector_impl_data._M_finish; pPVar12 = pPVar12 + 1) {
        uVar1 = pPVar12->index;
        plVar2 = (long *)(&((string *)local_b8._8_8_)->_M_dataplus)[uVar1 % (ulong)local_a8._M_nxt].
                         _M_p;
        plVar10 = (long *)0x0;
        if ((plVar2 != (long *)0x0) &&
           (plVar10 = plVar2, plVar14 = (long *)*plVar2, uVar1 != ((long *)*plVar2)[1])) {
          while (plVar2 = (long *)*plVar14, plVar2 != (long *)0x0) {
            plVar10 = (long *)0x0;
            if (((ulong)plVar2[1] % (ulong)local_a8._M_nxt != uVar1 % (ulong)local_a8._M_nxt) ||
               (plVar10 = plVar14, plVar14 = plVar2, uVar1 == plVar2[1])) goto LAB_0159188b;
          }
          plVar10 = (long *)0x0;
        }
LAB_0159188b:
        if ((plVar10 != (long *)0x0) && (*plVar10 != 0)) {
          update->update_is_del_and_insert = true;
          break;
        }
      }
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)pCVar11);
      puVar16 = puVar16 + 0x20;
    } while (puVar16 != puVar4);
  }
  proj_00 = auStack_88._32_8_;
  get_00 = auStack_88._24_8_;
  this_00 = auStack_88._16_8_;
  pPVar12 = (update->columns).
            super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pPVar3 = (update->columns).
           super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
           super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
           .super__Vector_impl_data._M_finish;
  do {
    if (pPVar12 == pPVar3) {
LAB_01591925:
      if (update->update_is_del_and_insert == true) {
        local_b8._0_8_ = auStack_88;
        local_b8._8_8_ = &DAT_00000001;
        local_a8._M_nxt = (_Hash_node_base *)0x0;
        pp_Stack_a0 = (__buckets_ptr)0x0;
        local_98 = CONCAT44(local_98._4_4_,0x3f800000);
        local_90._M_nxt = (_Hash_node_base *)0x0;
        auStack_88._0_8_ = (__node_base_ptr)0x0;
        CVar18 = ColumnList::Physical((ColumnList *)this_00);
        pCVar11 = CVar18.list;
        local_d8.physical = CVar18.physical;
        if (((undefined1  [16])CVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          local_d8.end = ((long)(pCVar11->columns).
                                super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                .
                                super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pCVar11->columns).
                                super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                .
                                super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x7b425ed097b425ed;
        }
        else {
          local_d8.end = (long)(pCVar11->physical_columns).
                               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pCVar11->physical_columns).
                               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3;
        }
        local_d8.pos = 0;
        if (((undefined1  [16])CVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          iVar15 = ((long)(pCVar11->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pCVar11->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
        }
        else {
          iVar15 = (long)(pCVar11->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pCVar11->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
        }
        if (((undefined1  [16])CVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          iVar17 = ((long)(pCVar11->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pCVar11->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
        }
        else {
          iVar17 = (long)(pCVar11->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pCVar11->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
        }
        local_d8.list = pCVar11;
        if ((iVar15 != 0) || (local_d8.end != iVar17)) {
          do {
            do {
              pCVar9 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                                 (&local_d8);
              local_50 = (idx_t)ColumnDefinition::Physical(pCVar9);
              local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8;
              ::std::
              _Hashtable<duckdb::PhysicalIndex,duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::PhysicalIndex>,duckdb::PhysicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<duckdb::PhysicalIndex,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::PhysicalIndex,true>>>>
                        ();
              local_d8.pos = local_d8.pos + 1;
            } while (local_d8.pos != iVar15);
          } while ((local_d8.end != iVar17) || (local_d8.list != pCVar11));
        }
        LogicalUpdate::BindExtraColumns
                  (this,(LogicalGet *)get_00,(LogicalProjection *)proj_00,update,
                   (physical_index_set_t *)local_b8);
        ::std::
        _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)local_b8);
      }
      ::std::vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>::~vector
                ((vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_> *)(local_f8 + 8));
      ::std::
      vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
      ::~vector(&local_48);
      return;
    }
    pCVar9 = ColumnList::GetColumn((ColumnList *)this_00,(PhysicalIndex)pPVar12->index);
    this_01 = ColumnDefinition::Type(pCVar9);
    bVar5 = LogicalType::SupportsRegularUpdate(this_01);
    if (!bVar5) {
      update->update_is_del_and_insert = true;
      goto LAB_01591925;
    }
    pPVar12 = pPVar12 + 1;
  } while( true );
}

Assistant:

void TableCatalogEntry::BindUpdateConstraints(Binder &binder, LogicalGet &get, LogicalProjection &proj,
                                              LogicalUpdate &update, ClientContext &context) {
	// check the constraints and indexes of the table to see if we need to project any additional columns
	// we do this for indexes with multiple columns and CHECK constraints in the UPDATE clause
	// suppose we have a constraint CHECK(i + j < 10); now we need both i and j to check the constraint
	// if we are only updating one of the two columns we add the other one to the UPDATE set
	// with a "useless" update (i.e. i=i) so we can verify that the CHECK constraint is not violated
	auto bound_constraints = binder.BindConstraints(constraints, name, columns);
	for (auto &constraint : bound_constraints) {
		if (constraint->type == ConstraintType::CHECK) {
			auto &check = constraint->Cast<BoundCheckConstraint>();
			// check constraint! check if we need to add any extra columns to the UPDATE clause
			LogicalUpdate::BindExtraColumns(*this, get, proj, update, check.bound_columns);
		}
	}
	if (update.return_chunk) {
		physical_index_set_t all_columns;
		for (auto &column : GetColumns().Physical()) {
			all_columns.insert(column.Physical());
		}
		LogicalUpdate::BindExtraColumns(*this, get, proj, update, all_columns);
	}
	// for index updates we always turn any update into an insert and a delete
	// we thus need all the columns to be available, hence we check if the update touches any index columns
	// If the returning keyword is used, we need access to the whole row in case the user requests it.
	// Therefore switch the update to a delete and insert.
	update.update_is_del_and_insert = false;
	TableStorageInfo table_storage_info = GetStorageInfo(context);
	for (auto index : table_storage_info.index_info) {
		for (auto &column : update.columns) {
			if (index.column_set.find(column.index) != index.column_set.end()) {
				update.update_is_del_and_insert = true;
				break;
			}
		}
	};

	// we also convert any updates on LIST columns into delete + insert
	for (auto &col_index : update.columns) {
		auto &column = GetColumns().GetColumn(col_index);
		if (!column.Type().SupportsRegularUpdate()) {
			update.update_is_del_and_insert = true;
			break;
		}
	}

	if (update.update_is_del_and_insert) {
		// the update updates a column required by an index or requires returning the updated rows,
		// push projections for all columns
		physical_index_set_t all_columns;
		for (auto &column : GetColumns().Physical()) {
			all_columns.insert(column.Physical());
		}
		LogicalUpdate::BindExtraColumns(*this, get, proj, update, all_columns);
	}
}